

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O3

bool absl::flags_internal::ParseFlagImpl<unsigned_int>(string_view text,uint *dst)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RAX;
  flags_internal *pfVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  uint in_R8D;
  flags_internal *this;
  string_view text_00;
  string_view text_01;
  string_view sVar9;
  uint32_t val;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  sVar9._M_len = text._M_str;
  sVar9._M_str = (char *)dst;
  sVar9 = StripLeadingAsciiWhitespace((absl *)text._M_len,sVar9);
  pcVar6 = sVar9._M_str;
  pfVar4 = (flags_internal *)sVar9._M_len;
  pcVar5 = pcVar6 + (long)pfVar4;
  pcVar8 = pcVar5;
  if (0 < (long)pfVar4 >> 2) {
    pcVar8 = pcVar6 + ((uint)sVar9._M_len & 3);
    pcVar7 = (char *)(((long)pfVar4 >> 2) + 1);
    do {
      in_R8D = (uint)(byte)pcVar5[-1];
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar5[-1]] & 8) == 0) goto LAB_00124bfb;
      in_R8D = (uint)(byte)pcVar5[-2];
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar5[-2]] & 8) == 0) {
        pcVar5 = pcVar5 + -1;
        goto LAB_00124bfb;
      }
      in_R8D = (uint)(byte)pcVar5[-3];
      if (((&ascii_internal::kPropertyBits)[(byte)pcVar5[-3]] & 8) == 0) {
        pcVar5 = pcVar5 + -2;
        goto LAB_00124bfb;
      }
      bVar1 = pcVar5[-4];
      in_R8D = (uint)bVar1;
      if (((&ascii_internal::kPropertyBits)[bVar1] & 8) == 0) {
        pcVar5 = pcVar5 + -3;
        goto LAB_00124bfb;
      }
      pcVar5 = pcVar5 + -4;
      pcVar7 = pcVar7 + -1;
      in_R8D = (uint)bVar1;
    } while (1 < (long)pcVar7);
  }
  pcVar7 = pcVar8 + -(long)pcVar6;
  if (pcVar7 != (char *)0x1) {
    if (pcVar7 != (char *)0x2) {
      pcVar5 = pcVar6;
      if ((pcVar7 != (char *)0x3) ||
         (pcVar7 = (char *)(ulong)(byte)pcVar8[-1], pcVar5 = pcVar8, (pcVar7[0x160d20] & 8U) == 0))
      goto LAB_00124bfb;
      pcVar8 = pcVar8 + -1;
    }
    pcVar7 = (char *)(ulong)(byte)pcVar8[-1];
    pcVar5 = pcVar8;
    if ((pcVar7[0x160d20] & 8U) == 0) goto LAB_00124bfb;
    pcVar8 = pcVar8 + -1;
  }
  pcVar7 = (char *)(ulong)(byte)pcVar8[-1];
  pcVar5 = pcVar8;
  if ((pcVar7[0x160d20] & 8U) != 0) {
    pcVar5 = pcVar6;
  }
LAB_00124bfb:
  this = (flags_internal *)(pcVar5 + -(long)pcVar6);
  if (pfVar4 < (flags_internal *)(pcVar5 + -(long)pcVar6)) {
    this = pfVar4;
  }
  text_00._M_str = pcVar7;
  text_00._M_len = (size_t)pcVar6;
  uVar3 = NumericBase(this,text_00);
  text_01._M_str = (char *)&local_24;
  text_01._M_len = (size_t)pcVar6;
  bVar2 = numbers_internal::safe_strtou32_base
                    ((numbers_internal *)this,text_01,(Nonnull<uint32_t_*>)(ulong)uVar3,in_R8D);
  *dst = local_24;
  return bVar2;
}

Assistant:

inline bool ParseFlagImpl(absl::string_view text, IntType& dst) {
  text = absl::StripAsciiWhitespace(text);

  return absl::numbers_internal::safe_strtoi_base(text, &dst,
                                                  NumericBase(text));
}